

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

void burstsort2_sampling_superalphabet_vector_block(uchar **strings,size_t n)

{
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *root_00;
  TrieNode<unsigned_short,_vector_block<unsigned_char_*,_128U>_> *root;
  size_t n_local;
  uchar **strings_local;
  
  root_00 = pseudo_sample<unsigned_short,vector_block<unsigned_char*,128u>>(strings,n);
  insert<32768u,vector_block<unsigned_char*,128u>,BurstSimple<unsigned_short>,unsigned_short>
            (root_00,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,128u>,unsigned_short>
            (root_00,strings,0,mkqsort);
  return;
}

Assistant:

void burstsort2_sampling_superalphabet_vector_block(unsigned char** strings, size_t n)
{
	typedef uint16_t CharT;
	typedef vector_block<unsigned char*, 128> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<32768, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}